

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O2

TreePutResult obx::internal::mapErrorToTreePutResult(obx_err err)

{
  TreePutResult TVar1;
  
  if (err == 0) {
    TVar1 = Success;
  }
  else if (err == 0x3e9) {
    TVar1 = DidNotPut;
  }
  else {
    if (err != 0x194) {
      return Undefined;
    }
    TVar1 = PathNotFound;
  }
  return TVar1;
}

Assistant:

TreePutResult mapErrorToTreePutResult(obx_err err) {
    if (err == OBX_SUCCESS) {
        return TreePutResult::Success;
    } else if (err == OBX_NOT_FOUND) {
        return TreePutResult::PathNotFound;
    } else if (err == OBX_NO_SUCCESS) {
        return TreePutResult::DidNotPut;
    } else {
        return TreePutResult::Undefined;
    }
}